

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

vector<Client_*,_std::allocator<Client_*>_> * __thiscall Server::Select(Server *this,double timeout)

{
  impl_ *piVar1;
  size_t sVar2;
  Client *pCVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  Socket_SelectFailed *this_00;
  char *e;
  Socket_Exception *this_01;
  pointer piVar9;
  reference ppCVar10;
  int iVar11;
  Client *local_d8;
  Client *client_2;
  iterator __end1_1;
  iterator __begin1_1;
  list<Client_*,_std::allocator<Client_*>_> *__range1_1;
  Client *client_1;
  iterator __end2;
  iterator __begin2;
  list<Client_*,_std::allocator<Client_*>_> *__range2;
  Client *client;
  iterator __end1;
  iterator __begin1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int result;
  SOCKET nfds;
  timeval timeout_val;
  long tsecs;
  double timeout_local;
  Server *this_local;
  
  _result = (long)timeout;
  timeout_val.tv_sec = (__time_t)((timeout - (double)_result) * 1000000.0);
  timeout_val.tv_usec = _result;
  if ((Select(double)::selected == '\0') &&
     (iVar6 = __cxa_guard_acquire(&Select(double)::selected), iVar6 != 0)) {
    std::vector<Client_*,_std::allocator<Client_*>_>::vector(&Select::selected);
    __cxa_atexit(std::vector<Client_*,_std::allocator<Client_*>_>::~vector,&Select::selected,
                 &__dso_handle);
    __cxa_guard_release(&Select(double)::selected);
  }
  __i = this->impl->sock;
  piVar1 = this->impl;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    (piVar1->read_fds).fds_bits[__arr._4_4_] = 0;
  }
  piVar1 = this->impl;
  for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
    (piVar1->write_fds).fds_bits[__arr_1._4_4_] = 0;
  }
  piVar1 = this->impl;
  for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
    (piVar1->except_fds).fds_bits[__arr_2._4_4_] = 0;
  }
  __end1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(&this->clients);
  client = (Client *)std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(&this->clients);
  while (bVar5 = std::operator!=(&__end1,(_Self *)&client), bVar5) {
    ppCVar10 = std::_List_iterator<Client_*>::operator*(&__end1);
    pCVar3 = *ppCVar10;
    sVar2 = pCVar3->recv_buffer_used;
    sVar8 = std::__cxx11::string::length();
    if (sVar2 != sVar8) {
      piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                         (&pCVar3->impl);
      iVar6 = piVar9->sock;
      piVar1 = this->impl;
      piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                         (&pCVar3->impl);
      iVar11 = piVar9->sock / 0x40;
      (piVar1->read_fds).fds_bits[iVar11] =
           1L << ((byte)((long)iVar6 % 0x40) & 0x3f) | (piVar1->read_fds).fds_bits[iVar11];
    }
    if (pCVar3->send_buffer_used != 0) {
      piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                         (&pCVar3->impl);
      iVar6 = piVar9->sock;
      piVar1 = this->impl;
      piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                         (&pCVar3->impl);
      iVar11 = piVar9->sock / 0x40;
      (piVar1->write_fds).fds_bits[iVar11] =
           1L << ((byte)((long)iVar6 % 0x40) & 0x3f) | (piVar1->write_fds).fds_bits[iVar11];
    }
    piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                       (&pCVar3->impl);
    iVar6 = piVar9->sock;
    piVar1 = this->impl;
    piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                       (&pCVar3->impl);
    iVar11 = piVar9->sock / 0x40;
    (piVar1->except_fds).fds_bits[iVar11] =
         1L << ((byte)((long)iVar6 % 0x40) & 0x3f) | (piVar1->except_fds).fds_bits[iVar11];
    piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                       (&pCVar3->impl);
    if ((int)__i < piVar9->sock) {
      piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                         (&pCVar3->impl);
      __i = piVar9->sock;
    }
    std::_List_iterator<Client_*>::operator++(&__end1);
  }
  iVar6 = this->impl->sock / 0x40;
  (this->impl->except_fds).fds_bits[iVar6] =
       1L << ((byte)((long)this->impl->sock % 0x40) & 0x3f) |
       (this->impl->except_fds).fds_bits[iVar6];
  iVar6 = select(__i + 1,(fd_set *)this->impl,(fd_set *)&this->impl->write_fds,
                 (fd_set *)&this->impl->except_fds,(timeval *)&result);
  if (iVar6 != -1) {
    if (0 < iVar6) {
      if (((this->impl->except_fds).fds_bits[this->impl->sock / 0x40] &
          1L << ((byte)((long)this->impl->sock % 0x40) & 0x3f)) != 0) {
        this_01 = (Socket_Exception *)__cxa_allocate_exception(0x10);
        Socket_Exception::Socket_Exception
                  (this_01,"There was an exception on the listening socket.");
        __cxa_throw(this_01,&Socket_Exception::typeinfo,Socket_Exception::~Socket_Exception);
      }
      __end2 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(&this->clients);
      client_1 = (Client *)
                 std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(&this->clients);
      while (bVar5 = std::operator!=(&__end2,(_Self *)&client_1), bVar5) {
        ppCVar10 = std::_List_iterator<Client_*>::operator*(&__end2);
        pCVar3 = *ppCVar10;
        piVar1 = this->impl;
        piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                           (&pCVar3->impl);
        uVar4 = (piVar1->except_fds).fds_bits[piVar9->sock / 0x40];
        piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                           (&pCVar3->impl);
        if ((uVar4 & 1L << ((byte)((long)piVar9->sock % 0x40) & 0x3f)) == 0) {
          piVar1 = this->impl;
          piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                             (&pCVar3->impl);
          uVar4 = (piVar1->read_fds).fds_bits[piVar9->sock / 0x40];
          piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                             (&pCVar3->impl);
          if (((uVar4 & 1L << ((byte)((long)piVar9->sock % 0x40) & 0x3f)) == 0) ||
             (bVar5 = Client::DoRecv(pCVar3), bVar5)) {
            piVar1 = this->impl;
            piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                               (&pCVar3->impl);
            uVar4 = (piVar1->write_fds).fds_bits[piVar9->sock / 0x40];
            piVar9 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                               (&pCVar3->impl);
            if (((uVar4 & 1L << ((byte)((long)piVar9->sock % 0x40) & 0x3f)) != 0) &&
               (bVar5 = Client::DoSend(pCVar3), !bVar5)) {
              Client::Close(pCVar3,true);
            }
          }
          else {
            Client::Close(pCVar3,true);
          }
        }
        else {
          Client::Close(pCVar3,true);
        }
        std::_List_iterator<Client_*>::operator++(&__end2);
      }
    }
    __end1_1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(&this->clients);
    client_2 = (Client *)
               std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(&this->clients);
    while (bVar5 = std::operator!=(&__end1_1,(_Self *)&client_2), bVar5) {
      ppCVar10 = std::_List_iterator<Client_*>::operator*(&__end1_1);
      local_d8 = *ppCVar10;
      if ((local_d8->recv_buffer_used != 0) ||
         (uVar7 = (**local_d8->_vptr_Client)(), (uVar7 & 1) != 0)) {
        std::vector<Client_*,_std::allocator<Client_*>_>::push_back(&Select::selected,&local_d8);
      }
      std::_List_iterator<Client_*>::operator++(&__end1_1);
    }
    return &Select::selected;
  }
  this_00 = (Socket_SelectFailed *)__cxa_allocate_exception(0x10);
  e = OSErrorString();
  Socket_SelectFailed::Socket_SelectFailed(this_00,e);
  __cxa_throw(this_00,&Socket_SelectFailed::typeinfo,Socket_SelectFailed::~Socket_SelectFailed);
}

Assistant:

std::vector<Client *> *Server::Select(double timeout)
{
	long tsecs = long(timeout);
	timeval timeout_val = {tsecs, long((timeout - double(tsecs))*1000000)};
	static std::vector<Client *> selected;
	SOCKET nfds = this->impl->sock;
	int result;

	FD_ZERO(&this->impl->read_fds);
	FD_ZERO(&this->impl->write_fds);
	FD_ZERO(&this->impl->except_fds);

	UTIL_FOREACH(this->clients, client)
	{
		if (client->recv_buffer_used != client->recv_buffer.length())
		{
			FD_SET(client->impl->sock, &this->impl->read_fds);
		}

		if (client->send_buffer_used > 0)
		{
			FD_SET(client->impl->sock, &this->impl->write_fds);
		}

		FD_SET(client->impl->sock, &this->impl->except_fds);

		if (client->impl->sock > nfds)
		{
			nfds = client->impl->sock;
		}
	}

	FD_SET(this->impl->sock, &this->impl->except_fds);

	result = select(nfds+1, &this->impl->read_fds, &this->impl->write_fds, &this->impl->except_fds, &timeout_val);

	if (result == -1)
	{
		throw Socket_SelectFailed(OSErrorString());
	}

	if (result > 0)
	{
		if (FD_ISSET(this->impl->sock, &this->impl->except_fds))
		{
			throw Socket_Exception("There was an exception on the listening socket.");
		}

		UTIL_FOREACH(this->clients, client)
		{
			if (FD_ISSET(client->impl->sock, &this->impl->except_fds))
			{
				client->Close(true);
				continue;
			}

			if (FD_ISSET(client->impl->sock, &this->impl->read_fds))
			{
				if (!client->DoRecv())
				{
					client->Close(true);
					continue;
				}
			}

			if (FD_ISSET(client->impl->sock, &this->impl->write_fds))
			{
				if (!client->DoSend())
				{
					client->Close(true);
					continue;
				}
			}
		}
	}

	UTIL_FOREACH(this->clients, client)
	{
		if (client->recv_buffer_used > 0 || client->NeedTick())
		{
			selected.push_back(client);
		}
	}

	return &selected;
}